

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O1

bool __thiscall IR::PropertySymOpnd::IsObjectHeaderInlined(PropertySymOpnd *this)

{
  bool bVar1;
  TypeId typeId;
  JITType *pJVar2;
  JITTypeHandler *this_00;
  nullptr_t local_20;
  JITTypeHolderBase<void> local_18;
  JITTypeHolder type;
  
  JITTypeHolderBase<void>::JITTypeHolderBase(&local_18,(JITType *)0x0);
  if ((this->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
     (bVar1 = ObjTypeSpecFldInfo::IsMono(this->objTypeSpecFldInfo), !bVar1)) {
    if ((this->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0) &&
       (bVar1 = ObjTypeSpecFldInfo::HasEquivalentTypeSet(this->objTypeSpecFldInfo), bVar1)) {
      local_18.t = (Type)GetFirstEquivalentType(this);
    }
  }
  else {
    local_18.t = (Type)GetType(this);
  }
  local_20 = (nullptr_t)0x0;
  bVar1 = JITTypeHolderBase<void>::operator!=(&local_18,&local_20);
  if (bVar1) {
    pJVar2 = JITTypeHolderBase<void>::operator->(&local_18);
    typeId = JITType::GetTypeId(pJVar2);
    bVar1 = Js::DynamicType::Is(typeId);
    if (bVar1) {
      pJVar2 = JITTypeHolderBase<void>::operator->(&local_18);
      this_00 = JITType::GetTypeHandler(pJVar2);
      bVar1 = JITTypeHandler::IsObjectHeaderInlinedTypeHandler(this_00);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool
PropertySymOpnd::IsObjectHeaderInlined() const
{
    JITTypeHolder type(nullptr);
    if (this->IsMono())
    {
        type = this->GetType();
    }
    else if (this->HasEquivalentTypeSet())
    {
        type = this->GetFirstEquivalentType();
    }

    if (type != nullptr && Js::DynamicType::Is(type->GetTypeId()))
    {
        return type->GetTypeHandler()->IsObjectHeaderInlinedTypeHandler();
    }

    return false;
}